

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::NumLayersParams::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,NumLayersParams *this,NumLayersParams *params)

{
  ostream *poVar1;
  char *__s;
  string kindStr;
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  __s = "2D Array Texture";
  if (this->textureKind == 0x806f) {
    __s = "3D Texture";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,__s,(allocator<char> *)&bStack_1c8);
  std::operator+(&bStack_1c8,&local_1a8,", ");
  poVar1 = std::operator<<((ostream *)local_188,(string *)&bStack_1c8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->numLayers);
  poVar1 = std::operator<<(poVar1," layers, ");
  poVar1 = std::operator<<(poVar1,"attached layer ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->attachmentLayer);
  std::operator<<(poVar1,".");
  std::__cxx11::string::~string((string *)&bStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

string NumLayersParams::getDescription (const NumLayersParams& params)
{
	ostringstream os;
	const string kindStr = (params.textureKind == GL_TEXTURE_3D
							? "3D Texture"
							: "2D Array Texture");
	os << kindStr + ", "
	   << params.numLayers << " layers, "
	   << "attached layer " << params.attachmentLayer << ".";
	return os.str();
}